

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O1

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::VisitSum(EExpr *__return_storage_ptr__,
          ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          *this,SumExpr expr)

{
  int iVar1;
  EExpr *ee1;
  long lVar2;
  BucketAccumulator<mp::EExpr> bucketaccum;
  EExpr local_6ff8;
  undefined1 local_6e38 [144];
  type local_6da8;
  type local_6da0;
  type local_6d98;
  undefined1 local_6d90 [24];
  pair<std::pair<int,_int>,_double> *local_6d78;
  ulong local_6d70;
  size_ty local_6d68;
  pair<std::pair<int,_int>,_double> local_6d60 [8];
  double *local_6ce0;
  ulong local_6cd8;
  ptr local_6cd0;
  double local_6cc8 [6];
  type local_6c98;
  type local_6c90;
  ptr local_6c88;
  undefined1 local_6c80 [24];
  int *local_6c68;
  ulong local_6c60;
  ptr local_6c58;
  int local_6c50 [6];
  type local_6c38;
  BucketAccum1Type<mp::QuadTerms> local_5038;
  
  if ((this->flat_cvt_).
      super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      .options_.useQP2Pass_ == 0) {
    BucketAccumulator<mp::EExpr>::BucketAccumulator
              ((BucketAccumulator<mp::EExpr> *)local_6e38,
               (long)*(int *)((long)expr.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                                    super_ExprBase.impl_ + 4));
    iVar1 = *(int *)((long)expr.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                           super_ExprBase.impl_ + 4);
    if ((long)iVar1 != 0) {
      lVar2 = 0;
      do {
        BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
        ::Visit(&local_6ff8,
                (BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
                 *)this,(Expr)((ExprBase *)
                              ((long)expr.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                                     super_ExprBase.impl_ + 8 + lVar2))->impl_);
        BucketAccumulator<mp::EExpr>::Add((BucketAccumulator<mp::EExpr> *)local_6e38,&local_6ff8);
        if (6 < local_6ff8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_6ff8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                          vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_6ff8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                          vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
        }
        if (6 < local_6ff8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_6ff8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                          vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_6ff8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                          vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
        }
        if (6 < local_6ff8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
          operator_delete(local_6ff8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                          coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                          local_6ff8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                          coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
        }
        if (8 < local_6ff8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
                super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                .m_data.
                super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                .m_capacity) {
          operator_delete(local_6ff8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                          folded_.
                          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                          .m_data.
                          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                          .m_data_ptr,
                          local_6ff8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                          folded_.
                          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                          .m_data.
                          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                          .m_capacity << 4);
        }
        if (6 < local_6ff8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_6ff8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_6ff8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
        }
        if (6 < local_6ff8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
                super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
          operator_delete(local_6ff8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_
                          .super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                          local_6ff8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_
                          .super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
        }
        lVar2 = lVar2 + 8;
      } while ((long)iVar1 * 8 != lVar2);
    }
    BucketAccumulator<mp::EExpr>::ExtractSum
              (__return_storage_ptr__,(BucketAccumulator<mp::EExpr> *)local_6e38);
    BucketAccum1Type<mp::QuadTerms>::~BucketAccum1Type(&local_5038);
    BucketAccum1Type<mp::LinTerms>::~BucketAccum1Type((BucketAccum1Type<mp::LinTerms> *)local_6e38);
  }
  else {
    local_6e38._8_8_ = this->p_qp2p_visitor_;
    local_6e38._0_8_ = &this->super_BasicProblemFlattener;
    local_6e38._72_8_ = local_6e38 + 0x60;
    local_6e38._40_8_ = (type)0x0;
    local_6e38._48_4_ = 0;
    local_6e38._56_8_ = (type)0x0;
    local_6e38._64_4_ = 0;
    local_6e38._16_8_ = (Impl *)0x0;
    local_6e38._24_8_ = (type)0x0;
    local_6e38._32_4_ = 0;
    local_6e38._80_8_ = 6;
    local_6e38._88_8_ = 0;
    local_6da0 = (type)0x6;
    local_6da8 = (type)local_6d90;
    local_6d98 = (type)0x0;
    local_6d70 = 8;
    local_6d78 = local_6d60;
    local_6d68 = 0;
    local_6cd8 = 6;
    local_6ce0 = local_6cc8;
    local_6cd0 = (ptr)0x0;
    local_6c90 = (type)0x6;
    local_6c98 = (type)local_6c80;
    local_6c88 = (ptr)0x0;
    local_6c60 = 6;
    local_6c68 = local_6c50;
    local_6c58 = (ptr)0x0;
    local_6c38 = (type)0x0;
    QP2Passes::Process((QP2Passes *)local_6e38,
                       (Expr)expr.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                             super_ExprBase.impl_);
    QP2Passes::GetResult(__return_storage_ptr__,(QP2Passes *)local_6e38);
    if (6 < local_6c60) {
      operator_delete(local_6c68,local_6c60 << 2);
    }
    if (6 < (ulong)local_6c90) {
      operator_delete((void *)local_6c98,(long)local_6c90 << 2);
    }
    if (6 < local_6cd8) {
      operator_delete(local_6ce0,local_6cd8 << 3);
    }
    if (8 < local_6d70) {
      operator_delete(local_6d78,local_6d70 << 4);
    }
    if (6 < (ulong)local_6da0) {
      operator_delete((void *)local_6da8,(long)local_6da0 << 2);
    }
    if (6 < (ulong)local_6e38._80_8_) {
      operator_delete((void *)local_6e38._72_8_,local_6e38._80_8_ << 3);
    }
    if ((type)local_6e38._24_8_ != (type)0x0) {
      operator_delete((void *)local_6e38._24_8_,local_6e38._56_8_ - local_6e38._24_8_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

EExpr VisitSum(typename BaseExprVisitor::SumExpr expr) {
    if (GetFlatCvt().IfParseQPIn2Passes()) {
#ifdef DEBUG_QP2PASSES
      static int depth=0;
      ++depth;
      {
        fmt::MemoryWriter wrt;
        wrt << "FLATTEN: ";
        WriteExpr<typename ProblemType::ExprTypes>(
            wrt, LinearExpr{}, Cast<NumericExpr>(expr),
            GetModel().GetVarNamer());
        fmt::print("{:{}}{}\n", "", depth*2, wrt.str());
      }
#endif
      QP2Passes qp2p {*this, GetQP2PVisitor()};
      qp2p.Process(expr);
      // return qp2p.GetResult();
      auto ee1 = qp2p.GetResult();
#ifdef DEBUG_QP2PASSES
      {
        fmt::MemoryWriter wrt;
        BucketAccumulator<EExpr> bucketaccum(expr.num_args());
        for (auto i =
             expr.begin(), end = expr.end(); i != end; ++i)
          bucketaccum.Add( MP_DISPATCH( Convert2EExpr(*i) ) );
        auto ee2 = bucketaccum.ExtractSum();
        wrt << "FLAT DONE: ";
        WriteExpr<typename ProblemType::ExprTypes>(
            wrt, LinearExpr{}, Cast<NumericExpr>(expr),
            GetModel().GetVarNamer());
        fmt::print("{:{}}{}\n{:{}}RESULT: ",
                   "", depth*2,  wrt.str(), "", depth*2);
        wrt.clear();
        wrt << ee1.constant_term() << " + ";
        WriteModelItem(wrt, ee1.GetBody(), GetFlatCvt().GetVarNamer());
        fmt::print("{}\n", wrt.str());
        wrt.clear();
        wrt << ee2.constant_term() << " + ";
        WriteModelItem(wrt, ee2.GetBody(), GetFlatCvt().GetVarNamer());
        fmt::print("{:{}}RESULT_BUCKETS: {}\n",
                   "", depth*2,  wrt.str());
        MP_ASSERT_ALWAYS(ee1 == ee2, "AAAKKKAAAAK ... ");
      }
      --depth;
#endif
      return ee1;
    }  // else
    BucketAccumulator<EExpr> bucketaccum(expr.num_args());
    for (auto i =
         expr.begin(), end = expr.end(); i != end; ++i)
      bucketaccum.Add( MP_DISPATCH( Convert2EExpr(*i) ) );
    return bucketaccum.ExtractSum();
  }